

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O0

bool __thiscall spvtools::opt::analysis::ScalarConstant::IsZero(ScalarConstant *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  reference puVar3;
  const_iterator cStack_30;
  uint32_t v;
  const_iterator __end3;
  const_iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  bool is_zero;
  ScalarConstant *this_local;
  
  iVar2 = (*(this->super_Constant)._vptr_Constant[0x18])();
  __end3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      CONCAT44(extraout_var,iVar2));
  cStack_30 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(extraout_var,iVar2));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffffd0);
    if (!bVar1) {
      return true;
    }
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end3);
    if (*puVar3 != 0) break;
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end3);
  }
  return false;
}

Assistant:

bool IsZero() const override {
    bool is_zero = true;
    for (uint32_t v : words()) {
      if (v != 0) {
        is_zero = false;
        break;
      }
    }
    return is_zero;
  }